

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall
mjs::object::add_own_property_names
          (object *this,vector<mjs::string,_std::allocator<mjs::string>_> *names,
          bool check_enumerable)

{
  gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>::gc_table,_true> *this_00;
  uint uVar1;
  bool bVar2;
  gc_vector<mjs::object::property> *pgVar3;
  gc_table *pgVar4;
  gc_table *pgVar5;
  gc_table *pgVar6;
  gc_heap *h;
  property local_40;
  
  pgVar3 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>,_true>::dereference
                     (&this->properties_,this->heap_);
  this_00 = &pgVar3->table_;
  pgVar4 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>::gc_table,_true>::dereference
                     (this_00,pgVar3->heap_);
  pgVar5 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>::gc_table,_true>::dereference
                     (this_00,pgVar3->heap_);
  pgVar6 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>::gc_table,_true>::dereference
                     (this_00,pgVar3->heap_);
  uVar1 = pgVar6->length_;
  if (pgVar4 != pgVar5 + uVar1) {
    h = (gc_heap *)(pgVar4 + 1);
    do {
      if (check_enumerable) {
        bVar2 = has_attributes(*(property_attribute *)((long)&(h->pointers_).set_ + 4),dont_enum);
        if (!bVar2) goto LAB_0015029e;
      }
      else {
LAB_0015029e:
        property::key(&local_40,h);
        std::vector<mjs::string,_std::allocator<mjs::string>_>::emplace_back<mjs::string>
                  (names,(string *)&local_40);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_40);
      }
      h = (gc_heap *)&h->alloc_context_;
    } while (h != (gc_heap *)(pgVar5 + (ulong)uVar1 + 1));
  }
  return;
}

Assistant:

void object::add_own_property_names(std::vector<string>& names, bool check_enumerable) const {
    for (auto& p : properties_.dereference(heap_)) { 
        if (!check_enumerable || !has_attributes(p.attributes(), property_attribute::dont_enum)) {
            names.push_back(p.key(heap_));
        }
    }
}